

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O2

int __thiscall create::Create::init(Create *this,EVP_PKEY_CTX *ctx)

{
  shared_ptr<create::Data> *this_00;
  ProtocolVersion PVar1;
  int extraout_EAX;
  Data *this_01;
  bool install_signal_handler_local;
  allocator_type local_4d;
  value_type_conflict local_4c;
  matrix<float,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<float,_std::allocator<float>_>_>
  local_48;
  
  this->powerLEDIntensity = '\0';
  this->mainMotorPower = '\0';
  this->sideMotorPower = '\0';
  this->vacuumMotorPower = '\0';
  this->debrisLED = '\0';
  this->spotLED = '\0';
  this->dockLED = '\0';
  this->checkLED = '\0';
  this->powerLED = '\0';
  this->prevTicksLeft = 0;
  this->prevTicksRight = 0;
  this->totalLeftDist = 0.0;
  this->totalRightDist = 0.0;
  this->firstOnData = true;
  this->mode = MODE_OFF;
  (this->pose).x = 0.0;
  (this->pose).y = 0.0;
  (this->pose).yaw = 0.0;
  local_4c = 0.0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,9,&local_4c,&local_4d);
  std::vector<float,_std::allocator<float>_>::_M_move_assign(&(this->pose).covariance,&local_48);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_48);
  (this->vel).x = 0.0;
  (this->vel).y = 0.0;
  (this->vel).yaw = 0.0;
  local_4c = 0.0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,9,&local_4c,&local_4d);
  std::vector<float,_std::allocator<float>_>::_M_move_assign(&(this->vel).covariance,&local_48);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&local_48);
  local_4c = 0.0;
  boost::numeric::ublas::
  matrix<float,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<float,_std::allocator<float>_>_>
  ::matrix(&local_48,3,3,&local_4c);
  boost::numeric::ublas::
  matrix<float,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<float,_std::allocator<float>_>_>
  ::operator=(&this->poseCovar,&local_48);
  boost::numeric::ublas::unbounded_array<float,_std::allocator<float>_>::~unbounded_array
            (&local_48.data_);
  this->requestedLeftVel = 0.0;
  this->requestedRightVel = 0.0;
  this->dtHistoryLength = 'd';
  this->modeReportWorkaround = false;
  this_01 = (Data *)operator_new(0x50);
  PVar1 = RobotModel::getVersion(&this->model);
  Data::Data(this_01,PVar1);
  std::__shared_ptr<create::Data,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<create::Data,void>
            ((__shared_ptr<create::Data,(__gnu_cxx::_Lock_policy)2> *)&local_48,this_01);
  this_00 = &this->data;
  std::__shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48.size2_);
  PVar1 = RobotModel::getVersion(&this->model);
  if (PVar1 == V_1) {
    std::make_shared<create::SerialQuery,std::shared_ptr<create::Data>&,bool&>
              ((shared_ptr<create::Data> *)&local_48,(bool *)this_00);
    std::__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2> *)&this->serial,
               (__shared_ptr<create::SerialQuery,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  }
  else {
    std::make_shared<create::SerialStream,std::shared_ptr<create::Data>&,unsigned_char_const&,bool&>
              ((shared_ptr<create::Data> *)&local_48,(uchar *)this_00,(bool *)&util::STREAM_HEADER);
    std::__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2> *)&this->serial,
               (__shared_ptr<create::SerialStream,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48.size2_);
  return extraout_EAX;
}

Assistant:

void Create::init(bool install_signal_handler) {
    mainMotorPower = 0;
    sideMotorPower = 0;
    vacuumMotorPower = 0;
    debrisLED = 0;
    spotLED = 0;
    dockLED = 0;
    checkLED = 0;
    powerLED = 0;
    powerLEDIntensity = 0;
    prevTicksLeft = 0;
    prevTicksRight = 0;
    totalLeftDist = 0.0;
    totalRightDist = 0.0;
    firstOnData = true;
    mode = MODE_OFF;
    pose.x = 0;
    pose.y = 0;
    pose.yaw = 0;
    pose.covariance = std::vector<float>(9, 0.0);
    vel.x = 0;
    vel.y = 0;
    vel.yaw = 0;
    vel.covariance = std::vector<float>(9, 0.0);
    poseCovar = Matrix(3, 3, 0.0);
    requestedLeftVel = 0;
    requestedRightVel = 0;
    dtHistoryLength = 100;
    modeReportWorkaround = false;
    data = std::shared_ptr<Data>(new Data(model.getVersion()));
    if (model.getVersion() == V_1) {
      serial = std::make_shared<SerialQuery>(data, install_signal_handler);
    } else {
      serial = std::make_shared<SerialStream>(
        data, create::util::STREAM_HEADER, install_signal_handler);
    }
  }